

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O3

void __thiscall Fossilize::ExternalReplayer::Impl::parse_message(Impl *this,char *msg)

{
  pointer *pppVar1;
  int iVar2;
  long lVar3;
  vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
  *this_00;
  iterator __position;
  char *end;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_30;
  ulonglong uStack_28;
  char *local_20;
  
  iVar2 = strncmp(msg,"MODULE",6);
  if (iVar2 == 0) {
    local_20 = (char *)strtoull(msg + 6,(char **)0x0,0x10);
    local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->faulty_spirv_modules;
  }
  else {
    iVar2 = strncmp(msg,"GRAPHICS_VERR",0xd);
    if (iVar2 == 0) {
      local_20 = (char *)strtoull(msg + 0xd,(char **)0x0,0x10);
      local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->graphics_failed_validation;
    }
    else {
      iVar2 = strncmp(msg,"COMPUTE_VERR",0xc);
      if (iVar2 == 0) {
        local_20 = (char *)strtoull(msg + 0xc,(char **)0x0,0x10);
        local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->compute_failed_validation;
      }
      else {
        iVar2 = strncmp(msg,"RAYTRACE_VERR",0xd);
        if (iVar2 != 0) {
          iVar2 = strncmp(msg,"GRAPHICS",8);
          if (iVar2 == 0) {
            local_20 = (char *)0x0;
            lVar3 = strtol(msg + 8,&local_20,0);
            if (local_20 == (char *)0x0 || (int)(uint)lVar3 < 0) {
              return;
            }
            uStack_28 = strtoull(local_20,(char **)0x0,0x10);
            local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)CONCAT44(local_30._4_4_,(uint)lVar3);
            __position._M_current =
                 (this->faulty_graphics_pipelines).
                 super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current !=
                (this->faulty_graphics_pipelines).
                super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              *(_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                **)__position._M_current = local_30;
              (__position._M_current)->second = uStack_28;
              pppVar1 = &(this->faulty_graphics_pipelines).
                         super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
              return;
            }
            this_00 = (vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
                       *)&this->faulty_graphics_pipelines;
          }
          else {
            iVar2 = strncmp(msg,"RAYTRACE",8);
            if (iVar2 == 0) {
              local_20 = (char *)0x0;
              lVar3 = strtol(msg + 8,&local_20,0);
              if (local_20 == (char *)0x0 || (int)(uint)lVar3 < 0) {
                return;
              }
              uStack_28 = strtoull(local_20,(char **)0x0,0x10);
              local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)CONCAT44(local_30._4_4_,(uint)lVar3);
              __position._M_current =
                   (this->faulty_raytracing_pipelines).
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (this->faulty_raytracing_pipelines).
                  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                *(_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  **)__position._M_current = local_30;
                (__position._M_current)->second = uStack_28;
                pppVar1 = &(this->faulty_raytracing_pipelines).
                           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pppVar1 = *pppVar1 + 1;
                return;
              }
              this_00 = (vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
                         *)&this->faulty_raytracing_pipelines;
            }
            else {
              iVar2 = strncmp(msg,"COMPUTE",7);
              if (iVar2 != 0) {
                return;
              }
              local_20 = (char *)0x0;
              lVar3 = strtol(msg + 7,&local_20,0);
              if (local_20 == (char *)0x0 || (int)(uint)lVar3 < 0) {
                return;
              }
              uStack_28 = strtoull(local_20,(char **)0x0,0x10);
              local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)CONCAT44(local_30._4_4_,(uint)lVar3);
              __position._M_current =
                   (this->faulty_compute_pipelines).
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (this->faulty_compute_pipelines).
                  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                *(_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  **)__position._M_current = local_30;
                (__position._M_current)->second = uStack_28;
                pppVar1 = &(this->faulty_compute_pipelines).
                           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pppVar1 = *pppVar1 + 1;
                return;
              }
              this_00 = (vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
                         *)&this->faulty_compute_pipelines;
            }
          }
          std::
          vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_int,unsigned_long>>
                    (this_00,__position,(pair<unsigned_int,_unsigned_long> *)&local_30);
          return;
        }
        local_20 = (char *)strtoull(msg + 0xd,(char **)0x0,0x10);
        local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->raytracing_failed_validation;
      }
    }
  }
  std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
            (local_30);
  return;
}

Assistant:

void ExternalReplayer::Impl::parse_message(const char *msg)
{
	if (strncmp(msg, "MODULE", 6) == 0)
	{
		auto hash = strtoull(msg + 6, nullptr, 16);
		faulty_spirv_modules.insert(hash);
	}
	else if (strncmp(msg, "GRAPHICS_VERR", 13) == 0)
	{
		auto hash = strtoull(msg + 13, nullptr, 16);
		graphics_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "COMPUTE_VERR", 12) == 0)
	{
		auto hash = strtoull(msg + 12, nullptr, 16);
		compute_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "RAYTRACE_VERR", 13) == 0)
	{
		auto hash = strtoull(msg + 13, nullptr, 16);
		raytracing_failed_validation.insert(hash);
	}
	else if (strncmp(msg, "GRAPHICS", 8) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 8, &end, 0));
		if (index >= 0 && end)
		{
			Hash graphics_pipeline = strtoull(end, nullptr, 16);
			faulty_graphics_pipelines.push_back({ unsigned(index), graphics_pipeline });
		}
	}
	else if (strncmp(msg, "RAYTRACE", 8) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 8, &end, 0));
		if (index >= 0 && end)
		{
			Hash raytrace_pipeline = strtoull(end, nullptr, 16);
			faulty_raytracing_pipelines.push_back({ unsigned(index), raytrace_pipeline });
		}
	}
	else if (strncmp(msg, "COMPUTE", 7) == 0)
	{
		char *end = nullptr;
		int index = int(strtol(msg + 7, &end, 0));
		if (index >= 0 && end)
		{
			Hash compute_pipeline = strtoull(end, nullptr, 16);
			faulty_compute_pipelines.push_back({ unsigned(index), compute_pipeline });
		}
	}
}